

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu.cpp
# Opt level: O2

int __thiscall ncnn::PReLU::forward_inplace(PReLU *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  int i;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  int j;
  ulong uVar9;
  uint uVar10;
  int c;
  Mat local_68;
  
  iVar4 = bottom_top_blob->dims;
  if (iVar4 == 3) {
    uVar10 = bottom_top_blob->h * bottom_top_blob->w;
    uVar5 = 0;
    uVar6 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar6 = uVar5;
    }
    iVar4 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      iVar4 = 0;
    }
    while (c = (int)uVar5, c != iVar4) {
      Mat::channel(&local_68,bottom_top_blob,c);
      pvVar7 = local_68.data;
      Mat::~Mat(&local_68);
      uVar8 = 0;
      if (1 < this->num_slope) {
        uVar8 = uVar5;
      }
      fVar1 = *(float *)((long)(this->slope_data).data + uVar8 * 4);
      for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        fVar2 = *(float *)((long)pvVar7 + uVar5 * 4);
        if (fVar2 < 0.0) {
          *(float *)((long)pvVar7 + uVar5 * 4) = fVar2 * fVar1;
        }
      }
      uVar5 = (ulong)(c + 1);
    }
  }
  else if (iVar4 == 2) {
    uVar10 = bottom_top_blob->w;
    uVar6 = 0;
    if (0 < (int)uVar10) {
      uVar6 = (ulong)uVar10;
    }
    pvVar7 = bottom_top_blob->data;
    uVar5 = (ulong)(uint)bottom_top_blob->h;
    if (bottom_top_blob->h < 1) {
      uVar5 = 0;
    }
    iVar4 = this->num_slope;
    for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      uVar9 = uVar8 & 0xffffffff;
      if (iVar4 < 2) {
        uVar9 = 0;
      }
      fVar1 = *(float *)((long)(this->slope_data).data + uVar9 * 4);
      for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
        fVar2 = *(float *)((long)pvVar7 + uVar9 * 4);
        if (fVar2 < 0.0) {
          *(float *)((long)pvVar7 + uVar9 * 4) = fVar2 * fVar1;
        }
      }
      pvVar7 = (void *)((long)pvVar7 + (long)(int)uVar10 * 4);
    }
  }
  else if (iVar4 == 1) {
    uVar10 = bottom_top_blob->w;
    pvVar7 = bottom_top_blob->data;
    pfVar3 = (float *)(this->slope_data).data;
    if (this->num_slope < 2) {
      fVar1 = *pfVar3;
      uVar5 = 0;
      uVar6 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar6 = uVar5;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        fVar2 = *(float *)((long)pvVar7 + uVar5 * 4);
        if (fVar2 < 0.0) {
          *(float *)((long)pvVar7 + uVar5 * 4) = fVar2 * fVar1;
        }
      }
    }
    else {
      uVar5 = 0;
      uVar6 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar6 = uVar5;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        fVar1 = *(float *)((long)pvVar7 + uVar5 * 4);
        if (fVar1 < 0.0) {
          *(float *)((long)pvVar7 + uVar5 * 4) = fVar1 * pfVar3[uVar5];
        }
      }
    }
  }
  return 0;
}

Assistant:

int PReLU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        if (num_slope > 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<w; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float slope = slope_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<w; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];

            for (int j=0; j<w; j++)
            {
                if (ptr[j] < 0)
                    ptr[j] *= slope;
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];

            for (int i=0; i<size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    return 0;
}